

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O0

void bk_lib::detail::fill<Clasp::DomainHeuristic::DomPrio>(DomPrio *first,DomPrio *last,DomPrio *x)

{
  uint uVar1;
  DomPrio *x_local;
  DomPrio *last_local;
  DomPrio *first_local;
  
  last_local._0_4_ = (int)last;
  first_local._0_4_ = (int)first;
  uVar1 = (int)last_local - (int)first_local;
  first_local = first;
  switch(uVar1 >> 3 & 7) {
  case 0:
    first_local = first;
    while (first_local != last) {
      *(undefined8 *)first_local->prio = *(undefined8 *)x->prio;
      first_local = first_local + 1;
switchD_002438f2_caseD_7:
      *(undefined8 *)first_local->prio = *(undefined8 *)x->prio;
      first_local = first_local + 1;
switchD_002438f2_caseD_6:
      *(undefined8 *)first_local->prio = *(undefined8 *)x->prio;
      first_local = first_local + 1;
switchD_002438f2_caseD_5:
      *(undefined8 *)first_local->prio = *(undefined8 *)x->prio;
      first_local = first_local + 1;
switchD_002438f2_caseD_4:
      *(undefined8 *)first_local->prio = *(undefined8 *)x->prio;
      first_local = first_local + 1;
switchD_002438f2_caseD_3:
      *(undefined8 *)first_local->prio = *(undefined8 *)x->prio;
      first_local = first_local + 1;
switchD_002438f2_caseD_2:
      *(undefined8 *)first_local->prio = *(undefined8 *)x->prio;
      first_local = first_local + 1;
switchD_002438f2_caseD_1:
      *(undefined8 *)first_local->prio = *(undefined8 *)x->prio;
      first_local = first_local + 1;
    }
    break;
  case 1:
    goto switchD_002438f2_caseD_1;
  case 2:
    goto switchD_002438f2_caseD_2;
  case 3:
    goto switchD_002438f2_caseD_3;
  case 4:
    goto switchD_002438f2_caseD_4;
  case 5:
    goto switchD_002438f2_caseD_5;
  case 6:
    goto switchD_002438f2_caseD_6;
  case 7:
    goto switchD_002438f2_caseD_7;
  }
  return;
}

Assistant:

void fill(T* first, T* last, const T& x) {
		assert(first <= last);
		switch ((last - first) & 7u)
		{
		case 0:
				while (first != last)
				{
				new(first++) T(x);
		case 7: new(first++) T(x);
		case 6: new(first++) T(x);
		case 5: new(first++) T(x);
		case 4: new(first++) T(x);
		case 3: new(first++) T(x);
		case 2: new(first++) T(x);
		case 1: new(first++) T(x);
				assert(first <= last);
				}
		}
	}